

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O0

int archive_random(void *buf,size_t nbytes)

{
  size_t nbytes_local;
  void *buf_local;
  
  la_arc4random_buf(buf,nbytes);
  return 0;
}

Assistant:

int
archive_random(void *buf, size_t nbytes)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
# if defined(HAVE_BCRYPT_H) && _WIN32_WINNT >= _WIN32_WINNT_VISTA
	NTSTATUS status;
	BCRYPT_ALG_HANDLE hAlg;

	status = BCryptOpenAlgorithmProvider(&hAlg, BCRYPT_RNG_ALGORITHM, NULL, 0);
	if (!BCRYPT_SUCCESS(status))
		return ARCHIVE_FAILED;
	status = BCryptGenRandom(hAlg, buf, (ULONG)nbytes, 0);
	BCryptCloseAlgorithmProvider(hAlg, 0);
	if (!BCRYPT_SUCCESS(status))
		return ARCHIVE_FAILED;

	return ARCHIVE_OK;
# else
	HCRYPTPROV hProv;
	BOOL success;

	success = CryptAcquireContext(&hProv, NULL, NULL, PROV_RSA_FULL,
	    CRYPT_VERIFYCONTEXT);
	if (!success && GetLastError() == (DWORD)NTE_BAD_KEYSET) {
		success = CryptAcquireContext(&hProv, NULL, NULL,
		    PROV_RSA_FULL, CRYPT_NEWKEYSET);
	}
	if (success) {
		success = CryptGenRandom(hProv, (DWORD)nbytes, (BYTE*)buf);
		CryptReleaseContext(hProv, 0);
		if (success)
			return ARCHIVE_OK;
	}
	/* TODO: Does this case really happen? */
	return ARCHIVE_FAILED;
# endif
#elif !defined(HAVE_ARC4RANDOM_BUF) && (!defined(_WIN32) || defined(__CYGWIN__))
	la_arc4random_buf(buf, nbytes);
	return ARCHIVE_OK;
#else
	arc4random_buf(buf, nbytes);
	return ARCHIVE_OK;
#endif
}